

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O0

void Gia_MuxStructDump_rec(Gia_Man_t *p,int iObj,int fFirst,Vec_Str_t *vStr,int nDigitsId)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  int iCtrl;
  Gia_Obj_t *pObj;
  int nDigitsId_local;
  Vec_Str_t *vStr_local;
  int fFirst_local;
  int iObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_ManObj(p,iObj);
  if ((fFirst != 0) ||
     ((iVar1 = Gia_ObjIsMuxId(p,iObj), iVar1 != 0 && (iVar1 = Gia_ObjRefNumId(p,iObj), iVar1 < 1))))
  {
    iVar1 = Gia_ObjFaninId2p(p,pObj_00);
    Vec_StrPush(vStr,'[');
    Vec_StrPush(vStr,'(');
    iVar2 = Gia_ObjIsMuxId(p,iVar1);
    if ((iVar2 == 0) || (iVar2 = Gia_ObjRefNumId(p,iVar1), iVar2 != 0)) {
      Vec_StrPrintNumStar(vStr,iVar1,nDigitsId);
    }
    else {
      Gia_MuxStructDump_rec(p,iVar1,0,vStr,nDigitsId);
    }
    Vec_StrPush(vStr,')');
    iVar1 = Gia_ObjFaninC2(p,pObj_00);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjFaninId1p(p,pObj_00);
      Gia_MuxStructDump_rec(p,iVar1,0,vStr,nDigitsId);
      Vec_StrPush(vStr,'|');
      iVar1 = Gia_ObjFaninId0p(p,pObj_00);
      Gia_MuxStructDump_rec(p,iVar1,0,vStr,nDigitsId);
      Vec_StrPush(vStr,']');
    }
    else {
      iVar1 = Gia_ObjFaninId0p(p,pObj_00);
      Gia_MuxStructDump_rec(p,iVar1,0,vStr,nDigitsId);
      Vec_StrPush(vStr,'|');
      iVar1 = Gia_ObjFaninId1p(p,pObj_00);
      Gia_MuxStructDump_rec(p,iVar1,0,vStr,nDigitsId);
      Vec_StrPush(vStr,']');
    }
  }
  return;
}

Assistant:

void Gia_MuxStructDump_rec( Gia_Man_t * p, int iObj, int fFirst, Vec_Str_t * vStr, int nDigitsId )
{
    Gia_Obj_t * pObj = Gia_ManObj( p, iObj );
    int iCtrl;
    if ( !fFirst && (!Gia_ObjIsMuxId(p, iObj) || Gia_ObjRefNumId(p, iObj) > 0) )
        return;
    iCtrl = Gia_ObjFaninId2p(p, pObj);
    Vec_StrPush( vStr, '[' );
    Vec_StrPush( vStr, '(' );
    if ( Gia_ObjIsMuxId(p, iCtrl) && Gia_ObjRefNumId(p, iCtrl) == 0 )
        Gia_MuxStructDump_rec( p, iCtrl, 0, vStr, nDigitsId );
    else
        Vec_StrPrintNumStar( vStr, iCtrl, nDigitsId );
    Vec_StrPush( vStr, ')' );
    if ( Gia_ObjFaninC2(p, pObj) )
    {
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId0p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, '|' );
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId1p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, ']' );
    }
    else
    {
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId1p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, '|' );
        Gia_MuxStructDump_rec( p, Gia_ObjFaninId0p(p, pObj), 0, vStr, nDigitsId );
        Vec_StrPush( vStr, ']' );
    }
}